

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

bool __thiscall
LLVMBC::ModuleParseContext::add_instruction(ModuleParseContext *this,Instruction *inst)

{
  BasicBlock *this_00;
  bool bVar1;
  LoggingCallback p_Var2;
  void *pvVar3;
  Instruction *inst_local;
  char buffer [4096];
  
  inst_local = inst;
  std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>::
  push_back(&this->instructions,&inst_local);
  this_00 = this->current_bb;
  if (this_00 == (BasicBlock *)0x0) {
    p_Var2 = dxil_spv::get_thread_log_callback();
    if (p_Var2 == (LoggingCallback)0x0) {
      fwrite("[ERROR]: No basic block is currently set!\n",0x2a,1,_stderr);
      fflush(_stderr);
    }
    else {
      builtin_strncpy(buffer,"No basic block is currently set!\n",0x22);
      pvVar3 = dxil_spv::get_thread_log_callback_userdata();
      (*p_Var2)(pvVar3,Error,buffer);
    }
  }
  else {
    BasicBlock::add_instruction(this_00,inst_local);
    bVar1 = Instruction::isTerminator(inst_local);
    if (bVar1) {
      finish_basic_block(this);
    }
    else {
      add_value(this,&inst_local->super_Value);
    }
  }
  return this_00 != (BasicBlock *)0x0;
}

Assistant:

bool ModuleParseContext::add_instruction(Instruction *inst)
{
	instructions.push_back(inst);

	if (current_bb)
		current_bb->add_instruction(inst);
	else
	{
		LOGE("No basic block is currently set!\n");
		return false;
	}

	if (inst->isTerminator())
		return finish_basic_block();
	else
		return add_value(inst);
}